

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O0

void __thiscall QPrintPreviewDialogPrivate::_q_zoomFactorChanged(QPrintPreviewDialogPrivate *this)

{
  bool *pbVar1;
  double *pdVar2;
  QPrintPreviewWidget *in_RDI;
  long in_FS_OFFSET;
  float fVar3;
  qreal factor;
  bool ok;
  QString text;
  qreal in_stack_ffffffffffffff88;
  QString *pQVar4;
  QPrintPreviewWidget *pQVar5;
  undefined1 on;
  QPrintPreviewDialogPrivate *in_stack_ffffffffffffffa0;
  double value;
  QPrintPreviewDialogPrivate *this_00;
  QChar local_32;
  double local_30;
  byte local_21;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  pQVar5 = in_RDI;
  QComboBox::lineEdit();
  on = (undefined1)((ulong)pQVar5 >> 0x38);
  QLineEdit::text();
  local_21 = 0xaa;
  QChar::QChar<char16_t,_true>(&local_32,L'%');
  pbVar1 = (bool *)QString::remove((QChar)(char16_t)&local_20,(uint)(ushort)local_32.ucs);
  fVar3 = (float)QString::toFloat(pbVar1);
  local_30 = (double)fVar3;
  this_00 = (QPrintPreviewDialogPrivate *)0x3ff0000000000000;
  value = 1000.0;
  pdVar2 = qMin<double>((double *)&stack0xffffffffffffffb8,&local_30);
  pdVar2 = qMax<double>((double *)&stack0xffffffffffffffc0,pdVar2);
  local_30 = *pdVar2;
  if ((local_21 & 1) != 0) {
    QPrintPreviewWidget::setZoomFactor(in_RDI,in_stack_ffffffffffffff88);
    pQVar4 = *(QString **)&in_RDI[0x13].field_0x20;
    formattedZoomFactor(this_00,value);
    QComboBox::setEditText(pQVar4);
    QString::~QString((QString *)0x17edb5);
    setFitting(in_stack_ffffffffffffffa0,(bool)on);
  }
  QString::~QString((QString *)0x17edcb);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::_q_zoomFactorChanged()
{
    QString text = zoomFactor->lineEdit()->text();
    bool ok;
    qreal factor = text.remove(u'%').toFloat(&ok);
    factor = qMax(qreal(1.0), qMin(qreal(1000.0), factor));
    if (ok) {
        preview->setZoomFactor(factor/100.0);
        zoomFactor->setEditText(formattedZoomFactor(factor));
        setFitting(false);
    }
}